

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_vector_s.c
# Opt level: O3

int cesl_vector_s_insert(cesl_vector_s_t *self,size_t index,void *elm_ptr)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  
  uVar1 = self->elems_count_;
  iVar3 = 0;
  if (uVar1 < self->elems_max_count_) {
    if (uVar1 != 0) {
      sVar2 = self->elem_max_size_;
      memmove(self->buffer_ + (index + 1) * sVar2,self->buffer_ + sVar2 * index,
              (uVar1 - index) * sVar2);
    }
    memcpy(self->buffer_ + index * self->elem_max_size_,elm_ptr,self->elem_max_size_);
    self->elems_count_ = self->elems_count_ + 1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int cesl_vector_s_insert(cesl_vector_s_t* self, size_t index, const void* elm_ptr)
{
    if (self->elems_count_ < self->elems_max_count_) {
        cesl_vector_s_move_elements(self, index, index + 1u);
        cesl_vector_s_insert_at(self, index, elm_ptr, self->elem_max_size_);
        return 1;
    }
    return 0;
}